

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeLlvm.cpp
# Opt level: O2

TypeBase * GetStackType(LlvmCompilationContext *ctx,TypeBase *valueType)

{
  ExpressionContext *pEVar1;
  long lVar2;
  
  pEVar1 = ctx->ctx;
  lVar2 = 0x89d8;
  if (((pEVar1->typeBool != valueType) && (pEVar1->typeChar != valueType)) &&
     (pEVar1->typeShort != valueType)) {
    if (pEVar1->typeFloat != valueType) {
      return valueType;
    }
    lVar2 = 0x89f0;
  }
  return *(TypeBase **)((long)(pEVar1->uniqueDependencies).little + lVar2 + -0x30);
}

Assistant:

TypeBase* GetStackType(LlvmCompilationContext &ctx, TypeBase *valueType)
{
	if(valueType == ctx.ctx.typeBool)
		return ctx.ctx.typeInt;

	if(valueType == ctx.ctx.typeChar)
		return ctx.ctx.typeInt;

	if(valueType == ctx.ctx.typeShort)
		return ctx.ctx.typeInt;

	if(valueType == ctx.ctx.typeFloat)
		return ctx.ctx.typeDouble;

	return valueType;
}